

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffdrivr.c
# Opt level: O2

FT_Error cff_get_cid_from_glyph_index(CFF_Face face,FT_UInt glyph_index,FT_UInt *cid)

{
  void *pvVar1;
  
  pvVar1 = (face->extra).data;
  if (pvVar1 != (void *)0x0) {
    if (*(int *)((long)pvVar1 + 0x74c) == 0xffff) {
      return 6;
    }
    if (*(uint *)((long)pvVar1 + 0x24) <= glyph_index) {
      return 6;
    }
    if (cid != (FT_UInt *)0x0) {
      *cid = (uint)*(ushort *)(*(long *)((long)pvVar1 + 0x520) + (ulong)glyph_index * 2);
    }
  }
  return 0;
}

Assistant:

static FT_Error
  cff_get_cid_from_glyph_index( CFF_Face  face,
                                FT_UInt   glyph_index,
                                FT_UInt  *cid )
  {
    FT_Error  error = FT_Err_Ok;
    CFF_Font  cff;


    cff = (CFF_Font)face->extra.data;

    if ( cff )
    {
      FT_UInt          c;
      CFF_FontRecDict  dict = &cff->top_font.font_dict;


      if ( dict->cid_registry == 0xFFFFU )
      {
        error = FT_THROW( Invalid_Argument );
        goto Fail;
      }

      if ( glyph_index >= cff->num_glyphs )
      {
        error = FT_THROW( Invalid_Argument );
        goto Fail;
      }

      c = cff->charset.sids[glyph_index];

      if ( cid )
        *cid = c;
    }

  Fail:
    return error;
  }